

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void ZopfliLZ77GetHistogramAt(ZopfliLZ77Store *lz77,size_t lpos,size_t *ll_counts,size_t *d_counts)

{
  long lVar1;
  bool bVar2;
  size_t i;
  size_t dpos;
  size_t llpos;
  size_t *d_counts_local;
  size_t *ll_counts_local;
  size_t lpos_local;
  ZopfliLZ77Store *lz77_local;
  
  lVar1 = (lpos / 0x120) * 0x120;
  for (i = 0; i < 0x120; i = i + 1) {
    ll_counts[i] = lz77->ll_counts[lVar1 + i];
  }
  i = lpos + 1;
  while( true ) {
    bVar2 = false;
    if (i < lVar1 + 0x120U) {
      bVar2 = i < lz77->size;
    }
    if (!bVar2) break;
    ll_counts[lz77->ll_symbol[i]] = ll_counts[lz77->ll_symbol[i]] - 1;
    i = i + 1;
  }
  for (i = 0; i < 0x20; i = i + 1) {
    d_counts[i] = lz77->d_counts[(lpos & 0xffffffffffffffe0) + i];
  }
  i = lpos + 1;
  while( true ) {
    bVar2 = false;
    if (i < (lpos & 0xffffffffffffffe0) + 0x20) {
      bVar2 = i < lz77->size;
    }
    if (!bVar2) break;
    if (lz77->dists[i] != 0) {
      d_counts[lz77->d_symbol[i]] = d_counts[lz77->d_symbol[i]] - 1;
    }
    i = i + 1;
  }
  return;
}

Assistant:

static void ZopfliLZ77GetHistogramAt(const ZopfliLZ77Store* lz77, size_t lpos,
                                     size_t* ll_counts, size_t* d_counts) {
  /* The real histogram is created by using the histogram for this chunk, but
  all superfluous values of this chunk subtracted. */
  size_t llpos = ZOPFLI_NUM_LL * (lpos / ZOPFLI_NUM_LL);
  size_t dpos = ZOPFLI_NUM_D * (lpos / ZOPFLI_NUM_D);
  size_t i;
  for (i = 0; i < ZOPFLI_NUM_LL; i++) {
    ll_counts[i] = lz77->ll_counts[llpos + i];
  }
  for (i = lpos + 1; i < llpos + ZOPFLI_NUM_LL && i < lz77->size; i++) {
    ll_counts[lz77->ll_symbol[i]]--;
  }
  for (i = 0; i < ZOPFLI_NUM_D; i++) {
    d_counts[i] = lz77->d_counts[dpos + i];
  }
  for (i = lpos + 1; i < dpos + ZOPFLI_NUM_D && i < lz77->size; i++) {
    if (lz77->dists[i] != 0) d_counts[lz77->d_symbol[i]]--;
  }
}